

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klvwalk.cpp
# Opt level: O0

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  char *__s;
  bool bVar1;
  int iVar2;
  allocator<char> local_49;
  value_type local_48;
  int local_24;
  char **ppcStack_20;
  int i;
  char **argv_local;
  CommandOptions *pCStack_10;
  int argc_local;
  CommandOptions *this_local;
  
  this->error_flag = true;
  this->version_flag = false;
  this->help_flag = false;
  this->verbose_flag = false;
  this->read_mxf_flag = false;
  this->walk_parts_flag = false;
  this->allow_skip_flag = false;
  ppcStack_20 = argv;
  argv_local._4_4_ = argc;
  pCStack_10 = this;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(&this->inFileList);
  local_24 = 1;
  do {
    if (argv_local._4_4_ <= local_24) {
      if (((this->help_flag & 1U) == 0) && ((this->version_flag & 1U) == 0)) {
        bVar1 = std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&this->inFileList);
        if (bVar1) {
          fputs("Input filename(s) required.\n",_stderr);
        }
        else {
          this->error_flag = false;
        }
      }
      return;
    }
    iVar2 = strcmp(ppcStack_20[local_24],"-help");
    if (iVar2 == 0) {
      this->help_flag = true;
    }
    else if (((*ppcStack_20[local_24] == '-') &&
             (iVar2 = isalpha((int)ppcStack_20[local_24][1]), iVar2 != 0)) &&
            (ppcStack_20[local_24][2] == '\0')) {
      switch(ppcStack_20[local_24][1]) {
      case 'V':
        this->version_flag = true;
        break;
      default:
        fprintf(_stderr,"Unrecognized option: %s\n",ppcStack_20[local_24]);
        return;
      case 'h':
        this->help_flag = true;
        break;
      case 'p':
        this->walk_parts_flag = true;
        break;
      case 'r':
        this->read_mxf_flag = true;
        break;
      case 's':
        this->allow_skip_flag = true;
        break;
      case 'v':
        this->verbose_flag = true;
      }
    }
    else {
      if (*ppcStack_20[local_24] == '-') {
        fprintf(_stderr,"Unrecognized option: %s\n",ppcStack_20[local_24]);
        return;
      }
      __s = ppcStack_20[local_24];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->inFileList,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

CommandOptions(int argc, const char** argv) :
     error_flag(true), version_flag(false), help_flag(false),
     verbose_flag(false), read_mxf_flag(false), walk_parts_flag(false),
     allow_skip_flag(false)
   {
     for ( int i = 1; i < argc; i++ )
       {

	 if ( (strcmp( argv[i], "-help") == 0) )
	   {
	     help_flag = true;
	     continue;
	   }
         
	 if ( argv[i][0] == '-' && isalpha(argv[i][1]) && argv[i][2] == 0 )
	   {
	     switch ( argv[i][1] )
	       {
	       case 'h': help_flag = true; break;
	       case 'r': read_mxf_flag = true; break;
	       case 'p': walk_parts_flag = true; break;
               case 's': allow_skip_flag = true; break;
	       case 'V': version_flag = true; break;
	       case 'v': verbose_flag = true; break;

	       default:
		 fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		 return;
	       }
	   }
	 else
	   {
	     if ( argv[i][0] != '-' )
	       inFileList.push_back(argv[i]);

	     else
	       {
       	         fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		 return;
	       }
	   }
       }

     if ( help_flag || version_flag )
       return;
     
     if ( inFileList.empty() )
       {
	 fputs("Input filename(s) required.\n", stderr);
	 return;
       }
     
     error_flag = false;
   }